

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FuncflParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::FuncflParameters> *this,string *id,FuncflParameters *data)

{
  FuncflParameters *in_RDX;
  FuncflParameters *in_RSI;
  undefined8 *in_RDI;
  
  GenericData::GenericData((GenericData *)in_RSI,(string *)in_RDX);
  *in_RDI = &PTR__SimpleTypeData_00503fc0;
  FuncflParameters::FuncflParameters(in_RSI,in_RDX);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}